

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall REPL::loop(REPL *this)

{
  AI *this_00;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  Position *other;
  char temp;
  Position pos;
  int y;
  string command;
  string buffer;
  istringstream ss;
  char local_209;
  Position local_208;
  uint local_1fc;
  REPL *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  this_00 = &this->ai;
  local_1f8 = this;
  do {
    local_1c8 = 0;
    local_1c0 = 0;
    local_1d0 = &local_1c0;
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_1d0,cVar2);
    if (local_1c8 == 0) {
      bVar3 = false;
    }
    else {
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
      local_1f0 = &local_1e0;
      local_1e8 = 0;
      local_1e0 = 0;
      std::operator>>((istream *)local_1b0,(string *)&local_1f0);
      iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar4 == 0) {
        pvVar1 = (local_1f8->ai).board;
        (local_1f8->ai).boardSize =
             ((long)(pvVar1->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar1->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
LAB_00102a5e:
        bVar3 = false;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
        if (iVar4 == 0) {
          piVar5 = std::operator>>((istream *)local_1b0,&local_209);
          piVar5 = (istream *)std::istream::operator>>(piVar5,&local_208.x);
          std::istream::operator>>(piVar5,(int *)&local_1fc);
          lVar7 = (long)local_208.x;
          local_208.x = (int)(lVar7 + -1);
          *(uint *)(*(long *)&(local_1f8->board).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar7 + -1].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl + -0x184 +
                   (long)local_209 * 4) = local_1fc;
          goto LAB_00102a5e;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
        if (iVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          goto LAB_00102a5e;
        }
        pcVar8 = "BEGIN";
        iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
        if (iVar4 == 0) {
          local_208 = AI::turn(this_00,(Position *)pcVar8);
          AI::putChess(this_00,local_208.x,local_208.y,1);
          poVar6 = operator<<((ostream *)&std::cout,&local_208);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          goto LAB_00102a5e;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
        if (iVar4 == 0) {
          piVar5 = std::operator>>((istream *)local_1b0,&local_209);
          std::istream::operator>>(piVar5,(int *)&local_1fc);
          local_1fc = local_1fc - 1;
          other = (Position *)(ulong)local_1fc;
          bVar3 = AI::putChess(this_00,local_1fc,local_209 + -0x61,2);
          if (bVar3) {
            local_208 = AI::turn(this_00,other);
            if (local_208.x < 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PASS",4);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              poVar6 = (ostream *)&std::cout;
            }
            else {
              AI::putChess(this_00,local_208.x,local_208.y,1);
              poVar6 = operator<<((ostream *)&std::cout,&local_208);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            }
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"input error",0xb);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
          goto LAB_00102a5e;
        }
        pcVar8 = "PASS";
        iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
        if (iVar4 == 0) {
          local_208 = AI::turn(this_00,(Position *)pcVar8);
          if (local_208.x < 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PASS",4);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            poVar6 = (ostream *)&std::cout;
          }
          else {
            AI::putChess(this_00,local_208.x,local_208.y,1);
            poVar6 = operator<<((ostream *)&std::cout,&local_208);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          }
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          goto LAB_00102a5e;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
        if (iVar4 != 0) goto LAB_00102a5e;
        bVar3 = true;
      }
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void REPL::loop() {
    while (true) {
        string buffer;
        getline(cin, buffer);
        if (buffer.empty()) continue;
        istringstream ss(buffer);

        string command;
        ss >> command;
        if (command == START) {
            ai.init();
        } else if (command == PLACE) {
            int x, y, z;
            char temp;
            ss >> temp >> y >> z;
            x = temp - 'a';
            --y;
            board[y][x] = z;
        } else if (command == DONE) {
            cout << "OK" << endl;
        } else if (command == BEGIN) {
            Position pos = ai.begin();
            ai.putChess(pos.x, pos.y, ME);
            cout << pos << endl;
        } else if (command == TURN) {
            int x, y;
            char temp;
            ss >> temp >> y;
            x = temp - 'a';
            --y;
            if (ai.putChess(y, x, OTHER)) {
                Position pos = ai.turn({x, y});
                if (pos.x >= 0) {
                    ai.putChess(pos.x, pos.y, ME);
                    cout << pos << endl;
                } else {
                    cout << PASS << endl;
                }
            } else {
                cout << "input error" << endl;
            }
        } else if (command == PASS) {
            Position pos = ai.turn({0, 0});
            if (pos.x >= 0) {
                ai.putChess(pos.x, pos.y, ME);
                cout << pos << endl;
            } else {
                cout << PASS << endl;
            }
        } else if (command == END) {
            break;
        }
        //printBoard();
    }
}